

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O2

TRef lj_ir_kslot(jit_State *J,TRef key,IRRef slot)

{
  ushort uVar1;
  IRIns *pIVar2;
  IRRef1 *pIVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  pIVar2 = (J->cur).ir;
  uVar4 = slot << 0x10 | key & 0xffff;
  pIVar3 = J->chain + 0x1e;
  do {
    uVar1 = *pIVar3;
    uVar5 = (uint)uVar1;
    if ((ulong)uVar1 == 0) {
      uVar5 = (J->cur).nk;
      if (uVar5 <= J->irbotlim) {
        lj_ir_growbot(J);
        pIVar2 = (J->cur).ir;
      }
      uVar5 = uVar5 - 1;
      uVar6 = (ulong)uVar5;
      (J->cur).nk = uVar5;
      pIVar2[uVar6].field_1.op12 = uVar4;
      *(undefined2 *)((long)pIVar2 + uVar6 * 8 + 4) = 0x1e05;
      *(IRRef1 *)((long)pIVar2 + uVar6 * 8 + 6) = J->chain[0x1e];
      J->chain[0x1e] = (IRRef1)uVar5;
      break;
    }
    pIVar3 = &pIVar2[uVar1].field_0.prev;
  } while (pIVar2[uVar1].field_1.op12 != uVar4);
  return uVar5 + 0x5000000;
}

Assistant:

TRef lj_ir_kslot(jit_State *J, TRef key, IRRef slot)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef2 op12 = IRREF2((IRRef1)key, (IRRef1)slot);
  IRRef ref;
  /* Const part is not touched by CSE/DCE, so 0-65535 is ok for IRMlit here. */
  lj_assertJ(tref_isk(key) && slot == (IRRef)(IRRef1)slot,
	     "out-of-range key/slot");
  for (ref = J->chain[IR_KSLOT]; ref; ref = cir[ref].prev)
    if (cir[ref].op12 == op12)
      goto found;
  ref = ir_nextk(J);
  ir = IR(ref);
  ir->op12 = op12;
  ir->t.irt = IRT_P32;
  ir->o = IR_KSLOT;
  ir->prev = J->chain[IR_KSLOT];
  J->chain[IR_KSLOT] = (IRRef1)ref;
found:
  return TREF(ref, IRT_P32);
}